

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O3

void __thiscall CNet::SetState(CNet *this,int iState)

{
  int *piVar1;
  uint uVar2;
  
  if (iState < 0x10) {
    if (iState == 1) {
      uVar2 = ((this->super_CObject).m_iState & 0xfffffffcU) + 1;
    }
    else {
      if (iState != 2) goto LAB_00118d8e;
      uVar2 = (this->super_CObject).m_iState & 0xfffffffcU | 2;
    }
  }
  else if (iState == 0x10) {
    uVar2 = (this->super_CObject).m_iState & 0xffffffcfU | 0x10;
  }
  else {
    if (iState != 0x20) {
      if (iState == 0x40) {
        piVar1 = &(this->super_CObject).m_iState;
        *(byte *)piVar1 = (byte)*piVar1 | 0x40;
        return;
      }
LAB_00118d8e:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                    ,0x24e,"void CNet::SetState(int)");
    }
    uVar2 = (this->super_CObject).m_iState & 0xffffffcfU | 0x20;
  }
  (this->super_CObject).m_iState = uVar2;
  return;
}

Assistant:

void CNet::SetState(int iState)
{
	switch(iState) {
	case STATE_NET_PREROUTED:
		m_iState	|=	STATE_NET_PREROUTED;
		break;
	//case STATE_NET_REROUTED:
	//	m_iState	&=	~STATE_NET_UNREROUTED;	
	//	m_iState	|=	STATE_NET_REROUTED;
	//	break;
	//case STATE_NET_UNREROUTED:
	//	m_iState	&=	~STATE_NET_REROUTED;	
	//	m_iState	|=	STATE_NET_UNREROUTED;
	//	break;		
	case STATE_NET_ROUTED:
		m_iState	&=	~STATE_NET_UNROUTED;	
		m_iState	|=	STATE_NET_ROUTED;
		break;
	case STATE_NET_UNROUTED:
		m_iState	&=	~STATE_NET_ROUTED;	
		m_iState	|=	STATE_NET_UNROUTED;
		break;
	case STATE_NET_BBOXDIRTY:
		m_iState	|=	STATE_NET_BBOXDIRTY;
		m_iState	&=	~STATE_NET_BBOXCLEAN;
		break;
	case STATE_NET_BBOXCLEAN:
		m_iState	|=	STATE_NET_BBOXCLEAN;
		m_iState	&=	~STATE_NET_BBOXDIRTY;
		break;
	default:
		assert(false);
		break;
	}
}